

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u64 fts3ChecksumIndex(Fts3Table *p,int iLangid,int iIndex,int *pRc)

{
  char *pcVar1;
  int iVar2;
  u64 uVar3;
  sqlite_int64 local_d0;
  i64 iVal;
  i64 iPos;
  i64 iCol;
  i64 iDocid;
  char *pEnd;
  char *pCsr;
  u64 cksum;
  undefined1 local_90 [4];
  int rc;
  Fts3MultiSegReader csr;
  Fts3SegFilter filter;
  int *pRc_local;
  int iIndex_local;
  int iLangid_local;
  Fts3Table *p_local;
  
  pCsr = (char *)0x0;
  memset(&csr.nDoclist,0,0x18);
  memset(local_90,0,0x58);
  cksum._4_4_ = sqlite3Fts3SegReaderCursor
                          (p,iLangid,iIndex,-2,(char *)0x0,0,0,1,(Fts3MultiSegReader *)local_90);
  if (cksum._4_4_ == 0) {
    cksum._4_4_ = sqlite3Fts3SegReaderStart
                            (p,(Fts3MultiSegReader *)local_90,(Fts3SegFilter *)&csr.nDoclist);
  }
  if (cksum._4_4_ == 0) {
    while (cksum._4_4_ = sqlite3Fts3SegReaderStep(p,(Fts3MultiSegReader *)local_90),
          cksum._4_4_ == 100) {
      pEnd = (char *)csr._64_8_;
      iDocid = csr._64_8_ + (long)(int)csr.aDoclist;
      iCol = 0;
      iPos = 0;
      iVal = 0;
      iVar2 = sqlite3Fts3GetVarint((char *)csr._64_8_,&iCol);
      pEnd = pEnd + iVar2;
      while (pEnd < (ulong)iDocid) {
        local_d0 = 0;
        iVar2 = sqlite3Fts3GetVarint(pEnd,&local_d0);
        pcVar1 = pCsr;
        pEnd = pEnd + iVar2;
        if (pEnd < (ulong)iDocid) {
          if ((local_d0 == 0) || (local_d0 == 1)) {
            iPos = 0;
            iVal = 0;
            if (local_d0 == 0) {
              iVar2 = sqlite3Fts3GetVarint(pEnd,&local_d0);
              pEnd = pEnd + iVar2;
              iCol = local_d0 + iCol;
            }
            else {
              iVar2 = sqlite3Fts3GetVarint(pEnd,&iPos);
              pEnd = pEnd + iVar2;
            }
          }
          else {
            iVal = local_d0 + -2 + iVal;
            uVar3 = fts3ChecksumEntry((char *)csr._48_8_,(int)csr.zTerm,iLangid,iIndex,iCol,
                                      (int)iPos,(int)iVal);
            pCsr = (char *)((ulong)pcVar1 ^ uVar3);
          }
        }
      }
    }
  }
  sqlite3Fts3SegReaderFinish((Fts3MultiSegReader *)local_90);
  *pRc = cksum._4_4_;
  return (u64)pCsr;
}

Assistant:

static u64 fts3ChecksumIndex(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id to return cksum for */
  int iIndex,                     /* Index to cksum (0..p->nIndex-1) */
  int *pRc                        /* OUT: Return code */
){
  Fts3SegFilter filter;
  Fts3MultiSegReader csr;
  int rc;
  u64 cksum = 0;

  assert( *pRc==SQLITE_OK );

  memset(&filter, 0, sizeof(filter));
  memset(&csr, 0, sizeof(csr));
  filter.flags =  FTS3_SEGMENT_REQUIRE_POS|FTS3_SEGMENT_IGNORE_EMPTY;
  filter.flags |= FTS3_SEGMENT_SCAN;

  rc = sqlite3Fts3SegReaderCursor(
      p, iLangid, iIndex, FTS3_SEGCURSOR_ALL, 0, 0, 0, 1,&csr
  );
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3SegReaderStart(p, &csr, &filter);
  }

  if( rc==SQLITE_OK ){
    while( SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, &csr)) ){
      char *pCsr = csr.aDoclist;
      char *pEnd = &pCsr[csr.nDoclist];

      i64 iDocid = 0;
      i64 iCol = 0;
      i64 iPos = 0;

      pCsr += sqlite3Fts3GetVarint(pCsr, &iDocid);
      while( pCsr<pEnd ){
        i64 iVal = 0;
        pCsr += sqlite3Fts3GetVarint(pCsr, &iVal);
        if( pCsr<pEnd ){
          if( iVal==0 || iVal==1 ){
            iCol = 0;
            iPos = 0;
            if( iVal ){
              pCsr += sqlite3Fts3GetVarint(pCsr, &iCol);
            }else{
              pCsr += sqlite3Fts3GetVarint(pCsr, &iVal);
              iDocid += iVal;
            }
          }else{
            iPos += (iVal - 2);
            cksum = cksum ^ fts3ChecksumEntry(
                csr.zTerm, csr.nTerm, iLangid, iIndex, iDocid,
                (int)iCol, (int)iPos
            );
          }
        }
      }
    }
  }
  sqlite3Fts3SegReaderFinish(&csr);

  *pRc = rc;
  return cksum;
}